

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O2

void bsp_get_point(void *handle,int idx,float *point)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = *(byte *)((long)handle + 8);
  for (uVar2 = 0; uVar2 < bVar1; uVar2 = uVar2 + 1) {
    point[uVar2] = *(float *)(*(long *)(*handle + uVar2 * 8) + (long)idx * 4);
  }
  return;
}

Assistant:

void
bsp_get_point(
    void * handle,
    int idx,
    float * point )
{
    bsp_tree * tree;
    int i;

    tree = (bsp_tree *) handle;
    assert( tree != NULL && point != NULL );

    assert( idx >= 0 && idx < array_count(tree->pointarrays[0]) );

    for ( i = 0; i < tree->dimensions; i++ )
        point[i] = tree->pointarrays[i][idx];
}